

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

int __thiscall CGraphics_Threaded::Init(CGraphics_Threaded *this)

{
  long lVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  IStorage *pIVar5;
  long *plVar6;
  CConfig *pCVar7;
  IConsole *pIVar8;
  long lVar9;
  IGraphicsBackend *pIVar10;
  CCommandBuffer *this_00;
  ulong uVar11;
  int x;
  ulong uVar12;
  ulong uVar13;
  int y;
  ulong uVar14;
  ulong uVar15;
  uchar uVar16;
  long in_FS_OFFSET;
  uchar aNullTextureData [4096];
  
  aNullTextureData[8] = '\0';
  aNullTextureData[9] = '\0';
  aNullTextureData[10] = '\0';
  aNullTextureData[0xb] = '\0';
  aNullTextureData[0xc] = '\0';
  aNullTextureData[0xd] = '\0';
  aNullTextureData[0xe] = '\0';
  aNullTextureData[0xf] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar5 = (IStorage *)
           (**(code **)(**(long **)&this->field_0x8 + 0x10))(*(long **)&this->field_0x8,"storage");
  this->m_pStorage = pIVar5;
  plVar6 = (long *)(**(code **)(**(long **)&this->field_0x8 + 0x10))
                             (*(long **)&this->field_0x8,"config");
  pCVar7 = (CConfig *)(**(code **)(*plVar6 + 0x30))(plVar6);
  this->m_pConfig = pCVar7;
  pIVar8 = (IConsole *)
           (**(code **)(**(long **)&this->field_0x8 + 0x10))(*(long **)&this->field_0x8,"console");
  this->m_pConsole = pIVar8;
  this->m_FirstFreeTexture = 0;
  for (lVar9 = 0x4806b; lVar9 != 0x4906a; lVar9 = lVar9 + 1) {
    *(int *)((long)this->m_apCommandBuffers + lVar9 * 4 + -0x68) = (int)lVar9 + -0x4806a;
  }
  this->m_aTextureIndices[0xfff] = -1;
  pIVar10 = CreateGraphicsBackend();
  this->m_pBackend = pIVar10;
  iVar4 = InitWindow(this);
  if (iVar4 == 0) {
    *(float *)&this->field_0x20 =
         (float)*(int *)&this->field_0x10 / (float)this->m_pConfig->m_GfxScreenWidth;
    for (lVar9 = 0xd; lVar9 != 0xf; lVar9 = lVar9 + 1) {
      this_00 = (CCommandBuffer *)operator_new(0x30);
      CCommandBuffer::CCommandBuffer(this_00,0x20000,0x200000);
      this->m_apCommandBuffers[lVar9 + -0xd] = this_00;
    }
    this->m_pCommandBuffer = this->m_apCommandBuffers[0];
    cVar3 = '\0';
    uVar11 = 0;
    for (uVar12 = 0; uVar12 != 0x20; uVar12 = uVar12 + 1) {
      uVar14 = 0;
      uVar13 = uVar11;
      for (lVar9 = -0x100; lVar9 != 0; lVar9 = lVar9 + 8) {
        cVar2 = (char)lVar9;
        if (uVar12 < 0x10) {
          if (uVar14 < 0x10) {
            aNullTextureData[uVar13] = cVar3 + cVar2 + '\x0f';
            aNullTextureData[uVar13 + 1] = '\0';
            uVar16 = '\0';
            uVar15 = uVar13;
          }
          else {
            aNullTextureData[uVar13] = '\0';
            uVar16 = cVar3 + cVar2 + 0x8f;
LAB_0012038d:
            uVar15 = uVar14 << 7 | uVar12 * 4;
            aNullTextureData[uVar13 + 1] = uVar16;
            uVar16 = '\0';
          }
        }
        else {
          if (0xf < uVar14) {
            uVar16 = cVar3 + cVar2 + '\x10';
            aNullTextureData[uVar13] = uVar16;
            goto LAB_0012038d;
          }
          (aNullTextureData + uVar13)[0] = '\0';
          (aNullTextureData + uVar13)[1] = '\0';
          uVar15 = uVar14 << 7 | uVar12 * 4;
          uVar16 = cVar3 + cVar2 + 0x8f;
        }
        aNullTextureData[uVar15 + 2] = uVar16;
        aNullTextureData[uVar15 + 3] = 0xff;
        uVar14 = uVar14 + 1;
        uVar13 = uVar13 + 0x80;
      }
      uVar11 = uVar11 + 4;
      cVar3 = cVar3 + '\b';
    }
    iVar4 = (**(code **)(*(long *)this + 0x80))(this,0x20,0x20,1,aNullTextureData,1,9);
    (this->m_InvalidTexture).m_Id = iVar4;
    iVar4 = 0;
  }
  else {
    iVar4 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int CGraphics_Threaded::Init()
{
	// fetch pointers
	m_pStorage = Kernel()->RequestInterface<IStorage>();
	m_pConfig = Kernel()->RequestInterface<IConfigManager>()->Values();
	m_pConsole = Kernel()->RequestInterface<IConsole>();

	// init textures
	m_FirstFreeTexture = 0;
	for(int i = 0; i < MAX_TEXTURES-1; i++)
		m_aTextureIndices[i] = i+1;
	m_aTextureIndices[MAX_TEXTURES-1] = -1;

	m_pBackend = CreateGraphicsBackend();
	if(InitWindow() != 0)
		return -1;

	m_ScreenHiDPIScale = m_ScreenWidth / (float)m_pConfig->m_GfxScreenWidth;

	// create command buffers
	for(int i = 0; i < NUM_CMDBUFFERS; i++)
		m_apCommandBuffers[i] = new CCommandBuffer(128*1024, 2*1024*1024);
	m_pCommandBuffer = m_apCommandBuffers[0];

	// create null texture, will get id=0
	unsigned char aNullTextureData[4*32*32];
	for(int x = 0; x < 32; ++x)
		for(int y = 0; y < 32; ++y)
		{
			if(x < 16)
			{
				if(y < 16)
				{
					aNullTextureData[4*(y*32+x)+0] = y*8+x*8+15;
					aNullTextureData[4*(y*32+x)+1] = 0;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
				else
				{
					aNullTextureData[4*(y*32+x)+0] = 0;
					aNullTextureData[4*(y*32+x)+1] = y*8+x*8-113;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
			}
			else
			{
				if(y < 16)
				{
					aNullTextureData[4*(y*32+x)+0] = 0;
					aNullTextureData[4*(y*32+x)+1] = 0;
					aNullTextureData[4*(y*32+x)+2] = y*8+x*8-113;
				}
				else
				{
					aNullTextureData[4*(y*32+x)+0] = y*8+x*8-496;
					aNullTextureData[4*(y*32+x)+1] = y*8+x*8-496;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
			}
			aNullTextureData[4*(y*32+x)+3] = 255;
		}

	m_InvalidTexture = LoadTextureRaw(32,32,CImageInfo::FORMAT_RGBA,aNullTextureData,CImageInfo::FORMAT_RGBA,TEXLOAD_NORESAMPLE|TEXLOAD_MULTI_DIMENSION);
	return 0;
}